

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompiledMixedType<signed_char,unsigned_char>(void)

{
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  int iVar2;
  uchar u;
  int local_38;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> st2;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> su;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_31;
  
  u = '\0';
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<unsigned_char>
            (&local_31,&u);
  su.m_int = u;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<unsigned_char>
            (&st2,&su);
  local_31.m_int = '\0';
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_31,
             &u);
  if (-1 < (char)su.m_int) {
    local_31.m_int = st2.m_int;
    SafeInt::operator_cast_to_unsigned_char((SafeInt *)&local_31);
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_31,u);
    SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
              (&local_31,st2);
    operator*(u,local_31);
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_31,u);
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_31,su);
    u = '\x01';
    iVar2 = 1;
    local_38 = iVar2;
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_31,&local_38);
    local_38 = iVar2;
    SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su,
               &local_38);
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_31,u);
    local_38 = iVar2;
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,
               &local_38);
    SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
              (&local_31,st2);
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_31,u);
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_31,su);
    u = '\x01';
    local_38 = iVar2;
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,
               &local_38);
    local_38 = iVar2;
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_31,&local_38);
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_31,u);
    SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
              (&local_31,st2);
    operator/(u,local_31);
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_31,u);
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_31,su);
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_31,u);
    SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
              (&local_31,st2);
    operator+(u,local_31);
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_31,u);
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_31,su);
    local_38 = 0;
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_31,&local_38);
    u = '\0';
    local_38 = 0;
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,
               &local_38);
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_31,u);
    SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
              (&local_31,st2);
    operator-(u,local_31);
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_31,u);
    local_38 = iVar2;
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_31,&local_38);
    local_38 = iVar2;
    SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su,
               &local_38);
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_31,su);
    u = '\x01';
    local_38 = iVar2;
    SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su,
               &local_38);
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_31,u);
    SVar1 = SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
                      ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       &local_31,su);
    operator<<(SVar1.m_int,su);
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_31,u);
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_31,su);
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_31,u);
    SVar1 = SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
                      ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       &local_31,su);
    operator>>(SVar1.m_int,su);
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_31,u);
    SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
              ((SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_31,su);
    SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
              (&local_31,st2);
    local_38._0_1_ = (SafeInt)(local_31.m_int & u & su.m_int);
    SafeInt::operator_cast_to_signed_char((SafeInt *)&local_38);
    local_31.m_int = su.m_int & u & local_31.m_int & st2.m_int;
    local_38._0_1_ = (SafeInt)(su.m_int | u);
    SafeInt::operator_cast_to_signed_char((SafeInt *)&local_38);
    local_31.m_int = su.m_int | u | local_31.m_int | st2.m_int;
    local_38 = CONCAT31(local_38._1_3_,su.m_int ^ u ^ local_31.m_int);
    SafeInt::operator_cast_to_signed_char((SafeInt *)&local_38);
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}